

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Edge.hpp
# Opt level: O0

bool __thiscall Edge::angleInRange(Edge *this,double angle,int k,int k_1)

{
  double dVar1;
  double dVar2;
  CoeffReturnType pdVar3;
  double in_XMM0_Qa;
  double k_ang_1;
  double k_ang;
  size_type in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  bool local_1;
  
  std::
  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::at((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        *)CONCAT17(in_stack_ffffffffffffffc7,
                   CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
       in_stack_ffffffffffffffb8);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::z
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x14cb23);
  dVar1 = *pdVar3;
  std::
  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::at((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        *)CONCAT17(in_stack_ffffffffffffffc7,
                   CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
       in_stack_ffffffffffffffb8);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::z
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x14cb44);
  dVar2 = *pdVar3;
  if (dVar1 <= dVar2) {
    local_1 = dVar1 + 1e-06 < in_XMM0_Qa && in_XMM0_Qa < dVar2 - 1e-06;
  }
  else {
    local_1 = dVar1 + 1e-06 < in_XMM0_Qa || in_XMM0_Qa < dVar2 - 1e-06;
  }
  return local_1;
}

Assistant:

bool angleInRange(double angle, int k, int k_1) const {
        const double k_ang = this->at(k).z(), k_ang_1 = this->at(k_1).z();
        if (k_ang > k_ang_1)        // 跨越奇异
            return (angle > k_ang + margin) || (angle < k_ang_1 - margin);
        else
            return (angle > k_ang + margin) && (angle < k_ang_1 - margin);
    }